

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_scalingFactorBetweenMultipliedUnits_Test::~Units_scalingFactorBetweenMultipliedUnits_Test
          (Units_scalingFactorBetweenMultipliedUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenMultipliedUnits)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("metre", 0, 3.0, 1000.0);
    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("metre", 0, 3.0, 1.0);

    EXPECT_EQ(1000.0, libcellml::Units::scalingFactor(u2, u1));
    EXPECT_EQ(0.001, libcellml::Units::scalingFactor(u1, u2));
}